

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_normalize_jac_many(mbedtls_ecp_group *grp,mbedtls_ecp_point **T,size_t T_size)

{
  undefined1 local_50 [8];
  mbedtls_mpi t;
  mbedtls_mpi *c;
  size_t i;
  int ret;
  size_t T_size_local;
  mbedtls_ecp_point **T_local;
  mbedtls_ecp_group *grp_local;
  
  if (T_size < 2) {
    grp_local._4_4_ = ecp_normalize_jac(grp,*T);
  }
  else {
    t._8_8_ = calloc(T_size,0x10);
    if ((void *)t._8_8_ == (void *)0x0) {
      grp_local._4_4_ = -0x4d80;
    }
    else {
      mbedtls_mpi_init((mbedtls_mpi *)local_50);
      mpi_init_many((mbedtls_mpi *)t._8_8_,T_size);
      i._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)t._8_8_,&(*T)->Z);
      if (i._4_4_ == 0) {
        for (c = (mbedtls_mpi *)0x1; c < T_size; c = (mbedtls_mpi *)((long)&c->p + 1)) {
          i._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)(t._8_8_ + (long)c * 0x10),
                                        (mbedtls_mpi *)(t._8_8_ + (long)&c[-1].field_0xf * 0x10),
                                        &T[(long)c]->Z);
          if (i._4_4_ != 0) goto LAB_0029dc50;
        }
        i._4_4_ = mbedtls_mpi_inv_mod((mbedtls_mpi *)(t._8_8_ + (T_size - 1) * 0x10),
                                      (mbedtls_mpi *)(t._8_8_ + (T_size - 1) * 0x10),&grp->P);
        if (i._4_4_ == 0) {
          c = (mbedtls_mpi *)(T_size - 1);
          do {
            if (c == (mbedtls_mpi *)0x0) {
              i._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)local_50,(mbedtls_mpi *)t._8_8_);
            }
            else {
              i._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_50,
                                            (mbedtls_mpi *)(t._8_8_ + (long)c * 0x10),
                                            (mbedtls_mpi *)(t._8_8_ + (long)&c[-1].field_0xf * 0x10)
                                           );
              if (i._4_4_ != 0) break;
              i._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)
                                                (t._8_8_ + (long)&c[-1].field_0xf * 0x10),
                                            (mbedtls_mpi *)(t._8_8_ + (long)c * 0x10),&T[(long)c]->Z
                                           );
            }
            if ((i._4_4_ != 0) ||
               (i._4_4_ = mbedtls_mpi_mul_mod(grp,&T[(long)c]->Y,&T[(long)c]->Y,
                                              (mbedtls_mpi *)local_50), i._4_4_ != 0)) break;
            i._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_50,(mbedtls_mpi *)local_50,
                                          (mbedtls_mpi *)local_50);
            if (((i._4_4_ != 0) ||
                (((i._4_4_ = mbedtls_mpi_mul_mod(grp,&T[(long)c]->X,&T[(long)c]->X,
                                                 (mbedtls_mpi *)local_50), i._4_4_ != 0 ||
                  (i._4_4_ = mbedtls_mpi_mul_mod(grp,&T[(long)c]->Y,&T[(long)c]->Y,
                                                 (mbedtls_mpi *)local_50), i._4_4_ != 0)) ||
                 (i._4_4_ = mbedtls_mpi_shrink(&T[(long)c]->X,(ulong)(grp->P).n), i._4_4_ != 0))))
               || (((i._4_4_ = mbedtls_mpi_shrink(&T[(long)c]->Y,(ulong)(grp->P).n), i._4_4_ != 0 ||
                    (i._4_4_ = mbedtls_mpi_lset(&T[(long)c]->Z,1), i._4_4_ != 0)) ||
                   (c == (mbedtls_mpi *)0x0)))) break;
            c = (mbedtls_mpi *)&c[-1].field_0xf;
          } while( true );
        }
      }
LAB_0029dc50:
      mbedtls_mpi_free((mbedtls_mpi *)local_50);
      mpi_free_many((mbedtls_mpi *)t._8_8_,T_size);
      free((void *)t._8_8_);
      grp_local._4_4_ = i._4_4_;
    }
  }
  return grp_local._4_4_;
}

Assistant:

static int ecp_normalize_jac_many(const mbedtls_ecp_group *grp,
                                  mbedtls_ecp_point *T[], size_t T_size)
{
    if (T_size < 2) {
        return ecp_normalize_jac(grp, *T);
    }

#if defined(MBEDTLS_ECP_NORMALIZE_JAC_MANY_ALT)
    if (mbedtls_internal_ecp_grp_capable(grp)) {
        return mbedtls_internal_ecp_normalize_jac_many(grp, T, T_size);
    }
#endif

#if defined(MBEDTLS_ECP_NO_FALLBACK) && defined(MBEDTLS_ECP_NORMALIZE_JAC_MANY_ALT)
    return MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
#else
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    mbedtls_mpi *c, t;

    if ((c = mbedtls_calloc(T_size, sizeof(mbedtls_mpi))) == NULL) {
        return MBEDTLS_ERR_ECP_ALLOC_FAILED;
    }

    mbedtls_mpi_init(&t);

    mpi_init_many(c, T_size);
    /*
     * c[i] = Z_0 * ... * Z_i,   i = 0,..,n := T_size-1
     */
    MPI_ECP_MOV(&c[0], &T[0]->Z);
    for (i = 1; i < T_size; i++) {
        MPI_ECP_MUL(&c[i], &c[i-1], &T[i]->Z);
    }

    /*
     * c[n] = 1 / (Z_0 * ... * Z_n) mod P
     */
    MPI_ECP_INV(&c[T_size-1], &c[T_size-1]);

    for (i = T_size - 1;; i--) {
        /* At the start of iteration i (note that i decrements), we have
         * - c[j] = Z_0 * .... * Z_j        for j  < i,
         * - c[j] = 1 / (Z_0 * .... * Z_j)  for j == i,
         *
         * This is maintained via
         * - c[i-1] <- c[i] * Z_i
         *
         * We also derive 1/Z_i = c[i] * c[i-1] for i>0 and use that
         * to do the actual normalization. For i==0, we already have
         * c[0] = 1 / Z_0.
         */

        if (i > 0) {
            /* Compute 1/Z_i and establish invariant for the next iteration. */
            MPI_ECP_MUL(&t,      &c[i], &c[i-1]);
            MPI_ECP_MUL(&c[i-1], &c[i], &T[i]->Z);
        } else {
            MPI_ECP_MOV(&t, &c[0]);
        }

        /* Now t holds 1 / Z_i; normalize as in ecp_normalize_jac() */
        MPI_ECP_MUL(&T[i]->Y, &T[i]->Y, &t);
        MPI_ECP_SQR(&t,       &t);
        MPI_ECP_MUL(&T[i]->X, &T[i]->X, &t);
        MPI_ECP_MUL(&T[i]->Y, &T[i]->Y, &t);

        /*
         * Post-precessing: reclaim some memory by shrinking coordinates
         * - not storing Z (always 1)
         * - shrinking other coordinates, but still keeping the same number of
         *   limbs as P, as otherwise it will too likely be regrown too fast.
         */
        MBEDTLS_MPI_CHK(mbedtls_mpi_shrink(&T[i]->X, grp->P.n));
        MBEDTLS_MPI_CHK(mbedtls_mpi_shrink(&T[i]->Y, grp->P.n));

        MPI_ECP_LSET(&T[i]->Z, 1);

        if (i == 0) {
            break;
        }
    }

cleanup:

    mbedtls_mpi_free(&t);
    mpi_free_many(c, T_size);
    mbedtls_free(c);

    return ret;
#endif /* !defined(MBEDTLS_ECP_NO_FALLBACK) || !defined(MBEDTLS_ECP_NORMALIZE_JAC_MANY_ALT) */
}